

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O1

void __thiscall Transporter::StartEventLoop(Transporter *this)

{
  thread local_28;
  _Bind<void_(Transporter::*(Transporter_*))()> local_20;
  
  local_20._M_f = (offset_in_Transporter_to_subr)Run;
  local_20._8_8_ = 0;
  local_20._M_bound_args.super__Tuple_impl<0UL,_Transporter_*>.
  super__Head_base<0UL,_Transporter_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_Transporter_*>)(_Tuple_impl<0UL,_Transporter_*>)this;
  std::thread::thread<std::_Bind<void(Transporter::*(Transporter*))()>,,void>(&local_28,&local_20);
  if ((this->thread)._M_id._M_thread == 0) {
    (this->thread)._M_id._M_thread = (native_handle_type)local_28._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

void Transporter::StartEventLoop()
{
	thread = std::thread(std::bind(&Transporter::Run, this));
}